

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

bool __thiscall GlobOpt::HasMemOp(GlobOpt *this,Loop *loop)

{
  MemOpList *pMVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  JITTimeFunctionBody *pJVar5;
  FunctionJITTimeInfo *pFVar6;
  
  if (loop == (Loop *)0x0) {
    return false;
  }
  if ((loop->field_0x179 & 4) != 0) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
    pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemSetPhase,uVar3,uVar4);
    if (bVar2) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar3 = JITTimeFunctionBody::GetSourceContextId(pJVar5);
      pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar4 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar6);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemCopyPhase,uVar3,uVar4);
      if (bVar2) {
        return false;
      }
    }
    if ((loop->memOpInfo != (MemOpInfo *)0x0) &&
       (pMVar1 = loop->memOpInfo->candidates, pMVar1 != (MemOpList *)0x0)) {
      return (MemOpList *)
             (pMVar1->super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next != pMVar1;
    }
  }
  return false;
}

Assistant:

bool GlobOpt::HasMemOp(Loop *loop)
{
#pragma prefast(suppress: 6285, "logical-or of constants is by design")
    return (
        loop &&
        loop->doMemOp &&
        (
            !PHASE_OFF(Js::MemSetPhase, this->func) ||
            !PHASE_OFF(Js::MemCopyPhase, this->func)
        ) &&
        loop->memOpInfo &&
        loop->memOpInfo->candidates &&
        !loop->memOpInfo->candidates->Empty()
    );
}